

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O3

void Gia_ManStop(Gia_Man_t *p)

{
  Vec_Vec_t *__ptr;
  void *pvVar1;
  int *piVar2;
  Vec_Wec_t *pVVar3;
  int iVar4;
  Vec_Wrd_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Flt_t *pVVar7;
  Vec_Int_t *pVVar8;
  long lVar9;
  long lVar10;
  
  Gia_DatFree(p->pUData);
  pVVar6 = p->vSeqModelVec;
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    iVar4 = pVVar6->nSize;
    if (0 < iVar4) {
      lVar9 = 0;
      do {
        if ((void *)0x2 < pVVar6->pArray[lVar9]) {
          free(pVVar6->pArray[lVar9]);
          iVar4 = pVVar6->nSize;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar4);
    }
    if (pVVar6->pArray != (void **)0x0) {
      free(pVVar6->pArray);
    }
    free(pVVar6);
  }
  Gia_ManStaticFanoutStop(p);
  Tim_ManStopP((Tim_Man_t **)&p->pManTime);
  if (p->pManTime != (void *)0x0) {
    __assert_fail("p->pManTime == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMan.c"
                  ,0x5a,"void Gia_ManStop(Gia_Man_t *)");
  }
  pVVar6 = p->vNamesIn;
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    iVar4 = pVVar6->nSize;
    if (0 < iVar4) {
      lVar9 = 0;
      do {
        if ((void *)0x2 < pVVar6->pArray[lVar9]) {
          free(pVVar6->pArray[lVar9]);
          iVar4 = pVVar6->nSize;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar4);
    }
    if (pVVar6->pArray != (void **)0x0) {
      free(pVVar6->pArray);
    }
    free(pVVar6);
  }
  pVVar6 = p->vNamesOut;
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    iVar4 = pVVar6->nSize;
    if (0 < iVar4) {
      lVar9 = 0;
      do {
        if ((void *)0x2 < pVVar6->pArray[lVar9]) {
          free(pVVar6->pArray[lVar9]);
          iVar4 = pVVar6->nSize;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar4);
    }
    if (pVVar6->pArray != (void **)0x0) {
      free(pVVar6->pArray);
    }
    free(pVVar6);
  }
  pVVar8 = p->vSwitching;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vSwitching->pArray = (int *)0x0;
      pVVar8 = p->vSwitching;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_002178ed;
    }
    free(pVVar8);
    p->vSwitching = (Vec_Int_t *)0x0;
  }
LAB_002178ed:
  pVVar8 = p->vSuper;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vSuper->pArray = (int *)0x0;
      pVVar8 = p->vSuper;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00217935;
    }
    free(pVVar8);
    p->vSuper = (Vec_Int_t *)0x0;
  }
LAB_00217935:
  pVVar8 = p->vStore;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vStore->pArray = (int *)0x0;
      pVVar8 = p->vStore;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_0021797d;
    }
    free(pVVar8);
    p->vStore = (Vec_Int_t *)0x0;
  }
LAB_0021797d:
  pVVar8 = p->vClassNew;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vClassNew->pArray = (int *)0x0;
      pVVar8 = p->vClassNew;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_002179c5;
    }
    free(pVVar8);
    p->vClassNew = (Vec_Int_t *)0x0;
  }
LAB_002179c5:
  pVVar8 = p->vClassOld;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vClassOld->pArray = (int *)0x0;
      pVVar8 = p->vClassOld;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00217a0d;
    }
    free(pVVar8);
    p->vClassOld = (Vec_Int_t *)0x0;
  }
LAB_00217a0d:
  pVVar5 = p->vSims;
  if (pVVar5 != (Vec_Wrd_t *)0x0) {
    if (pVVar5->pArray != (word *)0x0) {
      free(pVVar5->pArray);
      p->vSims->pArray = (word *)0x0;
      pVVar5 = p->vSims;
      if (pVVar5 == (Vec_Wrd_t *)0x0) goto LAB_00217a55;
    }
    free(pVVar5);
    p->vSims = (Vec_Wrd_t *)0x0;
  }
LAB_00217a55:
  pVVar5 = p->vSimsT;
  if (pVVar5 != (Vec_Wrd_t *)0x0) {
    if (pVVar5->pArray != (word *)0x0) {
      free(pVVar5->pArray);
      p->vSimsT->pArray = (word *)0x0;
      pVVar5 = p->vSimsT;
      if (pVVar5 == (Vec_Wrd_t *)0x0) goto LAB_00217a9d;
    }
    free(pVVar5);
    p->vSimsT = (Vec_Wrd_t *)0x0;
  }
LAB_00217a9d:
  pVVar5 = p->vSimsPi;
  if (pVVar5 != (Vec_Wrd_t *)0x0) {
    if (pVVar5->pArray != (word *)0x0) {
      free(pVVar5->pArray);
      p->vSimsPi->pArray = (word *)0x0;
      pVVar5 = p->vSimsPi;
      if (pVVar5 == (Vec_Wrd_t *)0x0) goto LAB_00217ae5;
    }
    free(pVVar5);
    p->vSimsPi = (Vec_Wrd_t *)0x0;
  }
LAB_00217ae5:
  pVVar5 = p->vSimsPo;
  if (pVVar5 != (Vec_Wrd_t *)0x0) {
    if (pVVar5->pArray != (word *)0x0) {
      free(pVVar5->pArray);
      p->vSimsPo->pArray = (word *)0x0;
      pVVar5 = p->vSimsPo;
      if (pVVar5 == (Vec_Wrd_t *)0x0) goto LAB_00217b2d;
    }
    free(pVVar5);
    p->vSimsPo = (Vec_Wrd_t *)0x0;
  }
LAB_00217b2d:
  pVVar8 = p->vTimeStamps;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vTimeStamps->pArray = (int *)0x0;
      pVVar8 = p->vTimeStamps;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00217b75;
    }
    free(pVVar8);
    p->vTimeStamps = (Vec_Int_t *)0x0;
  }
LAB_00217b75:
  pVVar7 = p->vTiming;
  if (pVVar7 != (Vec_Flt_t *)0x0) {
    if (pVVar7->pArray != (float *)0x0) {
      free(pVVar7->pArray);
      p->vTiming->pArray = (float *)0x0;
      pVVar7 = p->vTiming;
      if (pVVar7 == (Vec_Flt_t *)0x0) goto LAB_00217bbd;
    }
    free(pVVar7);
    p->vTiming = (Vec_Flt_t *)0x0;
  }
LAB_00217bbd:
  __ptr = p->vClockDoms;
  if (__ptr != (Vec_Vec_t *)0x0) {
    iVar4 = __ptr->nSize;
    if (0 < iVar4) {
      lVar9 = 0;
      do {
        pvVar1 = __ptr->pArray[lVar9];
        if (pvVar1 != (void *)0x0) {
          if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar1 + 8));
          }
          free(pvVar1);
          iVar4 = __ptr->nSize;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar4);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    p->vClockDoms = (Vec_Vec_t *)0x0;
  }
  pVVar8 = p->vCofVars;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vCofVars->pArray = (int *)0x0;
      pVVar8 = p->vCofVars;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00217c6f;
    }
    free(pVVar8);
    p->vCofVars = (Vec_Int_t *)0x0;
  }
LAB_00217c6f:
  pVVar8 = p->vIdsOrig;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vIdsOrig->pArray = (int *)0x0;
      pVVar8 = p->vIdsOrig;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00217cb7;
    }
    free(pVVar8);
    p->vIdsOrig = (Vec_Int_t *)0x0;
  }
LAB_00217cb7:
  pVVar8 = p->vIdsEquiv;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vIdsEquiv->pArray = (int *)0x0;
      pVVar8 = p->vIdsEquiv;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00217cff;
    }
    free(pVVar8);
    p->vIdsEquiv = (Vec_Int_t *)0x0;
  }
LAB_00217cff:
  pVVar8 = p->vLutConfigs;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vLutConfigs->pArray = (int *)0x0;
      pVVar8 = p->vLutConfigs;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00217d47;
    }
    free(pVVar8);
    p->vLutConfigs = (Vec_Int_t *)0x0;
  }
LAB_00217d47:
  pVVar8 = p->vEdgeDelay;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vEdgeDelay->pArray = (int *)0x0;
      pVVar8 = p->vEdgeDelay;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00217d8f;
    }
    free(pVVar8);
    p->vEdgeDelay = (Vec_Int_t *)0x0;
  }
LAB_00217d8f:
  pVVar8 = p->vEdgeDelayR;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vEdgeDelayR->pArray = (int *)0x0;
      pVVar8 = p->vEdgeDelayR;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00217dd7;
    }
    free(pVVar8);
    p->vEdgeDelayR = (Vec_Int_t *)0x0;
  }
LAB_00217dd7:
  pVVar8 = p->vEdge1;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vEdge1->pArray = (int *)0x0;
      pVVar8 = p->vEdge1;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00217e1f;
    }
    free(pVVar8);
    p->vEdge1 = (Vec_Int_t *)0x0;
  }
LAB_00217e1f:
  pVVar8 = p->vEdge2;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vEdge2->pArray = (int *)0x0;
      pVVar8 = p->vEdge2;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00217e67;
    }
    free(pVVar8);
    p->vEdge2 = (Vec_Int_t *)0x0;
  }
LAB_00217e67:
  pVVar8 = p->vUserPiIds;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vUserPiIds->pArray = (int *)0x0;
      pVVar8 = p->vUserPiIds;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00217eaf;
    }
    free(pVVar8);
    p->vUserPiIds = (Vec_Int_t *)0x0;
  }
LAB_00217eaf:
  pVVar8 = p->vUserPoIds;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vUserPoIds->pArray = (int *)0x0;
      pVVar8 = p->vUserPoIds;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00217ef7;
    }
    free(pVVar8);
    p->vUserPoIds = (Vec_Int_t *)0x0;
  }
LAB_00217ef7:
  pVVar8 = p->vUserFfIds;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vUserFfIds->pArray = (int *)0x0;
      pVVar8 = p->vUserFfIds;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00217f3f;
    }
    free(pVVar8);
    p->vUserFfIds = (Vec_Int_t *)0x0;
  }
LAB_00217f3f:
  pVVar8 = p->vFlopClasses;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vFlopClasses->pArray = (int *)0x0;
      pVVar8 = p->vFlopClasses;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00217f87;
    }
    free(pVVar8);
    p->vFlopClasses = (Vec_Int_t *)0x0;
  }
LAB_00217f87:
  pVVar8 = p->vGateClasses;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vGateClasses->pArray = (int *)0x0;
      pVVar8 = p->vGateClasses;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00217fcf;
    }
    free(pVVar8);
    p->vGateClasses = (Vec_Int_t *)0x0;
  }
LAB_00217fcf:
  pVVar8 = p->vObjClasses;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vObjClasses->pArray = (int *)0x0;
      pVVar8 = p->vObjClasses;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00218017;
    }
    free(pVVar8);
    p->vObjClasses = (Vec_Int_t *)0x0;
  }
LAB_00218017:
  pVVar8 = p->vInitClasses;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vInitClasses->pArray = (int *)0x0;
      pVVar8 = p->vInitClasses;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_0021805f;
    }
    free(pVVar8);
    p->vInitClasses = (Vec_Int_t *)0x0;
  }
LAB_0021805f:
  pVVar8 = p->vRegClasses;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vRegClasses->pArray = (int *)0x0;
      pVVar8 = p->vRegClasses;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_002180a7;
    }
    free(pVVar8);
    p->vRegClasses = (Vec_Int_t *)0x0;
  }
LAB_002180a7:
  pVVar8 = p->vRegInits;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vRegInits->pArray = (int *)0x0;
      pVVar8 = p->vRegInits;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_002180ef;
    }
    free(pVVar8);
    p->vRegInits = (Vec_Int_t *)0x0;
  }
LAB_002180ef:
  pVVar8 = p->vDoms;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vDoms->pArray = (int *)0x0;
      pVVar8 = p->vDoms;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00218137;
    }
    free(pVVar8);
    p->vDoms = (Vec_Int_t *)0x0;
  }
LAB_00218137:
  pVVar8 = p->vBarBufs;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vBarBufs->pArray = (int *)0x0;
      pVVar8 = p->vBarBufs;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_0021817f;
    }
    free(pVVar8);
    p->vBarBufs = (Vec_Int_t *)0x0;
  }
LAB_0021817f:
  pVVar8 = p->vXors;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vXors->pArray = (int *)0x0;
      pVVar8 = p->vXors;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_002181c7;
    }
    free(pVVar8);
    p->vXors = (Vec_Int_t *)0x0;
  }
LAB_002181c7:
  pVVar8 = p->vLevels;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vLevels->pArray = (int *)0x0;
      pVVar8 = p->vLevels;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_0021820f;
    }
    free(pVVar8);
    p->vLevels = (Vec_Int_t *)0x0;
  }
LAB_0021820f:
  pVVar8 = p->vTruths;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vTruths->pArray = (int *)0x0;
      pVVar8 = p->vTruths;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00218257;
    }
    free(pVVar8);
    p->vTruths = (Vec_Int_t *)0x0;
  }
LAB_00218257:
  piVar2 = (p->vCopies).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vCopies).pArray = (int *)0x0;
  }
  (p->vCopies).nCap = 0;
  (p->vCopies).nSize = 0;
  piVar2 = (p->vCopies2).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vCopies2).pArray = (int *)0x0;
  }
  (p->vCopies2).nCap = 0;
  (p->vCopies2).nSize = 0;
  pVVar8 = p->vVar2Obj;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vVar2Obj->pArray = (int *)0x0;
      pVVar8 = p->vVar2Obj;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_002182ed;
    }
    free(pVVar8);
    p->vVar2Obj = (Vec_Int_t *)0x0;
  }
LAB_002182ed:
  piVar2 = (p->vCopiesTwo).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vCopiesTwo).pArray = (int *)0x0;
  }
  (p->vCopiesTwo).nCap = 0;
  (p->vCopiesTwo).nSize = 0;
  piVar2 = (p->vSuppVars).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vSuppVars).pArray = (int *)0x0;
  }
  (p->vSuppVars).nCap = 0;
  (p->vSuppVars).nSize = 0;
  pVVar5 = p->vSuppWords;
  if (pVVar5 != (Vec_Wrd_t *)0x0) {
    if (pVVar5->pArray != (word *)0x0) {
      free(pVVar5->pArray);
      p->vSuppWords->pArray = (word *)0x0;
      pVVar5 = p->vSuppWords;
      if (pVVar5 == (Vec_Wrd_t *)0x0) goto LAB_00218383;
    }
    free(pVVar5);
    p->vSuppWords = (Vec_Wrd_t *)0x0;
  }
LAB_00218383:
  pVVar8 = p->vTtNums;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vTtNums->pArray = (int *)0x0;
      pVVar8 = p->vTtNums;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_002183cb;
    }
    free(pVVar8);
    p->vTtNums = (Vec_Int_t *)0x0;
  }
LAB_002183cb:
  pVVar8 = p->vTtNodes;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vTtNodes->pArray = (int *)0x0;
      pVVar8 = p->vTtNodes;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00218413;
    }
    free(pVVar8);
    p->vTtNodes = (Vec_Int_t *)0x0;
  }
LAB_00218413:
  pVVar5 = p->vTtMemory;
  if (pVVar5 != (Vec_Wrd_t *)0x0) {
    if (pVVar5->pArray != (word *)0x0) {
      free(pVVar5->pArray);
      p->vTtMemory->pArray = (word *)0x0;
      pVVar5 = p->vTtMemory;
      if (pVVar5 == (Vec_Wrd_t *)0x0) goto LAB_0021845b;
    }
    free(pVVar5);
    p->vTtMemory = (Vec_Wrd_t *)0x0;
  }
LAB_0021845b:
  pVVar6 = p->vTtInputs;
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    if (pVVar6->pArray != (void **)0x0) {
      free(pVVar6->pArray);
      p->vTtInputs->pArray = (void **)0x0;
      pVVar6 = p->vTtInputs;
      if (pVVar6 == (Vec_Ptr_t *)0x0) goto LAB_002184a3;
    }
    free(pVVar6);
    p->vTtInputs = (Vec_Ptr_t *)0x0;
  }
LAB_002184a3:
  pVVar8 = p->vMapping;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vMapping->pArray = (int *)0x0;
      pVVar8 = p->vMapping;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_002184eb;
    }
    free(pVVar8);
    p->vMapping = (Vec_Int_t *)0x0;
  }
LAB_002184eb:
  pVVar3 = p->vMapping2;
  if (pVVar3 != (Vec_Wec_t *)0x0) {
    iVar4 = pVVar3->nCap;
    pVVar8 = pVVar3->pArray;
    if (iVar4 < 1) {
      if (pVVar8 != (Vec_Int_t *)0x0) goto LAB_00218541;
    }
    else {
      lVar10 = 8;
      lVar9 = 0;
      do {
        pvVar1 = *(void **)((long)&pVVar8->nCap + lVar10);
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
          pVVar8 = pVVar3->pArray;
          *(undefined8 *)((long)&pVVar8->nCap + lVar10) = 0;
          iVar4 = pVVar3->nCap;
        }
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0x10;
      } while (lVar9 < iVar4);
LAB_00218541:
      free(pVVar8);
    }
    free(pVVar3);
    p->vMapping2 = (Vec_Wec_t *)0x0;
  }
  pVVar3 = p->vFanouts2;
  if (pVVar3 != (Vec_Wec_t *)0x0) {
    iVar4 = pVVar3->nCap;
    pVVar8 = pVVar3->pArray;
    if (iVar4 < 1) {
      if (pVVar8 != (Vec_Int_t *)0x0) goto LAB_002185af;
    }
    else {
      lVar10 = 8;
      lVar9 = 0;
      do {
        pvVar1 = *(void **)((long)&pVVar8->nCap + lVar10);
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
          pVVar8 = pVVar3->pArray;
          *(undefined8 *)((long)&pVVar8->nCap + lVar10) = 0;
          iVar4 = pVVar3->nCap;
        }
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0x10;
      } while (lVar9 < iVar4);
LAB_002185af:
      free(pVVar8);
    }
    free(pVVar3);
    p->vFanouts2 = (Vec_Wec_t *)0x0;
  }
  pVVar8 = p->vCellMapping;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vCellMapping->pArray = (int *)0x0;
      pVVar8 = p->vCellMapping;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_0021860f;
    }
    free(pVVar8);
    p->vCellMapping = (Vec_Int_t *)0x0;
  }
LAB_0021860f:
  pVVar8 = p->vPacking;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vPacking->pArray = (int *)0x0;
      pVVar8 = p->vPacking;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00218657;
    }
    free(pVVar8);
    p->vPacking = (Vec_Int_t *)0x0;
  }
LAB_00218657:
  pVVar8 = p->vConfigs;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vConfigs->pArray = (int *)0x0;
      pVVar8 = p->vConfigs;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_0021869f;
    }
    free(pVVar8);
    p->vConfigs = (Vec_Int_t *)0x0;
  }
LAB_0021869f:
  if (p->pCellStr != (char *)0x0) {
    free(p->pCellStr);
    p->pCellStr = (char *)0x0;
  }
  pVVar7 = p->vInArrs;
  if (pVVar7 != (Vec_Flt_t *)0x0) {
    if (pVVar7->pArray != (float *)0x0) {
      free(pVVar7->pArray);
      p->vInArrs->pArray = (float *)0x0;
      pVVar7 = p->vInArrs;
      if (pVVar7 == (Vec_Flt_t *)0x0) goto LAB_00218703;
    }
    free(pVVar7);
    p->vInArrs = (Vec_Flt_t *)0x0;
  }
LAB_00218703:
  pVVar7 = p->vOutReqs;
  if (pVVar7 != (Vec_Flt_t *)0x0) {
    if (pVVar7->pArray != (float *)0x0) {
      free(pVVar7->pArray);
      p->vOutReqs->pArray = (float *)0x0;
      pVVar7 = p->vOutReqs;
      if (pVVar7 == (Vec_Flt_t *)0x0) goto LAB_0021874b;
    }
    free(pVVar7);
    p->vOutReqs = (Vec_Flt_t *)0x0;
  }
LAB_0021874b:
  pVVar8 = p->vCiArrs;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vCiArrs->pArray = (int *)0x0;
      pVVar8 = p->vCiArrs;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00218793;
    }
    free(pVVar8);
    p->vCiArrs = (Vec_Int_t *)0x0;
  }
LAB_00218793:
  pVVar8 = p->vCoReqs;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vCoReqs->pArray = (int *)0x0;
      pVVar8 = p->vCoReqs;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_002187db;
    }
    free(pVVar8);
    p->vCoReqs = (Vec_Int_t *)0x0;
  }
LAB_002187db:
  pVVar8 = p->vCoArrs;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vCoArrs->pArray = (int *)0x0;
      pVVar8 = p->vCoArrs;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00218823;
    }
    free(pVVar8);
    p->vCoArrs = (Vec_Int_t *)0x0;
  }
LAB_00218823:
  pVVar8 = p->vCoAttrs;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vCoAttrs->pArray = (int *)0x0;
      pVVar8 = p->vCoAttrs;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_0021886b;
    }
    free(pVVar8);
    p->vCoAttrs = (Vec_Int_t *)0x0;
  }
LAB_0021886b:
  if (p->pAigExtra != (Gia_Man_t *)0x0) {
    Gia_ManStop(p->pAigExtra);
    p->pAigExtra = (Gia_Man_t *)0x0;
  }
  pVVar8 = p->vCis;
  piVar2 = pVVar8->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar8);
  pVVar8 = p->vCos;
  piVar2 = pVVar8->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar8);
  piVar2 = (p->vHash).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vHash).pArray = (int *)0x0;
  }
  (p->vHash).nCap = 0;
  (p->vHash).nSize = 0;
  piVar2 = (p->vHTable).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vHTable).pArray = (int *)0x0;
  }
  (p->vHTable).nCap = 0;
  (p->vHTable).nSize = 0;
  piVar2 = (p->vRefs).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vRefs).pArray = (int *)0x0;
  }
  (p->vRefs).nCap = 0;
  (p->vRefs).nSize = 0;
  if (p->pData2 != (uint *)0x0) {
    free(p->pData2);
    p->pData2 = (uint *)0x0;
  }
  if (p->pTravIds != (int *)0x0) {
    free(p->pTravIds);
    p->pTravIds = (int *)0x0;
  }
  if (p->pPlacement != (Gia_Plc_t *)0x0) {
    free(p->pPlacement);
    p->pPlacement = (Gia_Plc_t *)0x0;
  }
  if (p->pSwitching != (uchar *)0x0) {
    free(p->pSwitching);
    p->pSwitching = (uchar *)0x0;
  }
  if (p->pCexSeq != (Abc_Cex_t *)0x0) {
    free(p->pCexSeq);
    p->pCexSeq = (Abc_Cex_t *)0x0;
  }
  if (p->pCexComb != (Abc_Cex_t *)0x0) {
    free(p->pCexComb);
    p->pCexComb = (Abc_Cex_t *)0x0;
  }
  if (p->pIso != (int *)0x0) {
    free(p->pIso);
    p->pIso = (int *)0x0;
  }
  if (p->pFanData != (int *)0x0) {
    free(p->pFanData);
    p->pFanData = (int *)0x0;
  }
  if (p->pReprsOld != (int *)0x0) {
    free(p->pReprsOld);
    p->pReprsOld = (int *)0x0;
  }
  if (p->pReprs != (Gia_Rpr_t *)0x0) {
    free(p->pReprs);
    p->pReprs = (Gia_Rpr_t *)0x0;
  }
  if (p->pNexts != (int *)0x0) {
    free(p->pNexts);
    p->pNexts = (int *)0x0;
  }
  if (p->pSibls != (int *)0x0) {
    free(p->pSibls);
    p->pSibls = (int *)0x0;
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  if (p->pLutRefs != (int *)0x0) {
    free(p->pLutRefs);
    p->pLutRefs = (int *)0x0;
  }
  if (p->pMuxes != (uint *)0x0) {
    free(p->pMuxes);
    p->pMuxes = (uint *)0x0;
  }
  if (p->pObjs != (Gia_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Gia_Obj_t *)0x0;
  }
  if (p->pSpec != (char *)0x0) {
    free(p->pSpec);
    p->pSpec = (char *)0x0;
  }
  if (p->pName != (char *)0x0) {
    free(p->pName);
  }
  free(p);
  return;
}

Assistant:

void Gia_ManStop( Gia_Man_t * p )
{
    extern void Gia_DatFree( Gia_Dat_t * p );
    Gia_DatFree( p->pUData );
    if ( p->vSeqModelVec )
        Vec_PtrFreeFree( p->vSeqModelVec );
    Gia_ManStaticFanoutStop( p );
    Tim_ManStopP( (Tim_Man_t **)&p->pManTime );
    assert( p->pManTime == NULL );
    Vec_PtrFreeFree( p->vNamesIn );
    Vec_PtrFreeFree( p->vNamesOut );
    Vec_IntFreeP( &p->vSwitching );
    Vec_IntFreeP( &p->vSuper );
    Vec_IntFreeP( &p->vStore );
    Vec_IntFreeP( &p->vClassNew );
    Vec_IntFreeP( &p->vClassOld );
    Vec_WrdFreeP( &p->vSims );
    Vec_WrdFreeP( &p->vSimsT );
    Vec_WrdFreeP( &p->vSimsPi );
    Vec_WrdFreeP( &p->vSimsPo );
    Vec_IntFreeP( &p->vTimeStamps );
    Vec_FltFreeP( &p->vTiming );
    Vec_VecFreeP( &p->vClockDoms );
    Vec_IntFreeP( &p->vCofVars );
    Vec_IntFreeP( &p->vIdsOrig );
    Vec_IntFreeP( &p->vIdsEquiv );
    Vec_IntFreeP( &p->vLutConfigs );
    Vec_IntFreeP( &p->vEdgeDelay );
    Vec_IntFreeP( &p->vEdgeDelayR );
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    Vec_IntFreeP( &p->vUserPiIds );
    Vec_IntFreeP( &p->vUserPoIds );
    Vec_IntFreeP( &p->vUserFfIds );
    Vec_IntFreeP( &p->vFlopClasses );
    Vec_IntFreeP( &p->vGateClasses );
    Vec_IntFreeP( &p->vObjClasses );
    Vec_IntFreeP( &p->vInitClasses );
    Vec_IntFreeP( &p->vRegClasses );
    Vec_IntFreeP( &p->vRegInits );
    Vec_IntFreeP( &p->vDoms );
    Vec_IntFreeP( &p->vBarBufs );
    Vec_IntFreeP( &p->vXors );
    Vec_IntFreeP( &p->vLevels );
    Vec_IntFreeP( &p->vTruths );
    Vec_IntErase( &p->vCopies );
    Vec_IntErase( &p->vCopies2 );
    Vec_IntFreeP( &p->vVar2Obj );
    Vec_IntErase( &p->vCopiesTwo );
    Vec_IntErase( &p->vSuppVars );
    Vec_WrdFreeP( &p->vSuppWords );
    Vec_IntFreeP( &p->vTtNums );
    Vec_IntFreeP( &p->vTtNodes );
    Vec_WrdFreeP( &p->vTtMemory );
    Vec_PtrFreeP( &p->vTtInputs );
    Vec_IntFreeP( &p->vMapping );
    Vec_WecFreeP( &p->vMapping2 );
    Vec_WecFreeP( &p->vFanouts2 );
    Vec_IntFreeP( &p->vCellMapping );
    Vec_IntFreeP( &p->vPacking );
    Vec_IntFreeP( &p->vConfigs );
    ABC_FREE( p->pCellStr );
    Vec_FltFreeP( &p->vInArrs );
    Vec_FltFreeP( &p->vOutReqs );
    Vec_IntFreeP( &p->vCiArrs );
    Vec_IntFreeP( &p->vCoReqs );
    Vec_IntFreeP( &p->vCoArrs );
    Vec_IntFreeP( &p->vCoAttrs );
    Gia_ManStopP( &p->pAigExtra );
    Vec_IntFree( p->vCis );
    Vec_IntFree( p->vCos );
    Vec_IntErase( &p->vHash );
    Vec_IntErase( &p->vHTable );
    Vec_IntErase( &p->vRefs );
    ABC_FREE( p->pData2 );
    ABC_FREE( p->pTravIds );
    ABC_FREE( p->pPlacement );
    ABC_FREE( p->pSwitching );
    ABC_FREE( p->pCexSeq );
    ABC_FREE( p->pCexComb );
    ABC_FREE( p->pIso );
//    ABC_FREE( p->pMapping );
    ABC_FREE( p->pFanData );
    ABC_FREE( p->pReprsOld );
    ABC_FREE( p->pReprs );
    ABC_FREE( p->pNexts );
    ABC_FREE( p->pSibls );
    ABC_FREE( p->pRefs );
    ABC_FREE( p->pLutRefs );
    ABC_FREE( p->pMuxes );
    ABC_FREE( p->pObjs );
    ABC_FREE( p->pSpec );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}